

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O2

void __thiscall Omega_h::Write<int>::~Write(Write<int> *this)

{
  Alloc *pAVar1;
  Alloc *this_00;
  
  this_00 = *(Alloc **)this;
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    pAVar1 = this_00 + 0x30;
    *(int *)pAVar1 = *(int *)pAVar1 + -1;
    if (*(int *)pAVar1 == 0) {
      Omega_h::Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      return;
    }
  }
  return;
}

Assistant:

OMEGA_H_INLINE LO size() const OMEGA_H_NOEXCEPT { return write_.size(); }